

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall
QWidgetRepaintManager::markNeedsFlush
          (QWidgetRepaintManager *this,QWidget *widget,QRegion *region,QPoint *topLevelOffset)

{
  QDebug QVar1;
  bool bVar2;
  char cVar3;
  QWidget *parent;
  QLoggingCategory *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QRegion local_d8;
  undefined1 local_d0 [8];
  QDebug local_c8;
  QRegion local_c0;
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  QPoint local_98;
  undefined4 uStack_90;
  undefined8 uStack_8c;
  undefined4 local_84;
  char *local_80;
  QDebug local_78;
  QRegion local_70;
  QDebug local_68;
  undefined1 local_60 [8];
  QDebug local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget != (QWidget *)0x0) {
    bVar2 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)&widget->field_0x8);
    if (!bVar2) {
      cVar3 = QRegion::isEmpty();
      if (cVar3 == '\0') {
        if (*(QWidget **)this == widget) {
          pQVar4 = QtPrivateLogging::lcWidgetPainting();
          if (((pQVar4->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
            local_80 = pQVar4->name;
            local_98.xp.m_i = 2;
            local_98.yp.m_i = 0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_84 = 0;
            QMessageLogger::info();
            QVar1.stream = local_78.stream;
            QVar12.m_data = (storage_type *)0x7;
            QVar12.m_size = (qsizetype)local_50;
            QString::fromUtf8(QVar12);
            QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_78.stream,' ');
            }
            *(int *)((QTextStream *)local_78.stream + 0x28) =
                 *(int *)((QTextStream *)local_78.stream + 0x28) + 1;
            ::operator<<((Stream *)&local_68,&local_70);
            QVar1.stream = local_68.stream;
            QVar13.m_data = (storage_type *)0xc;
            QVar13.m_size = (qsizetype)local_50;
            QString::fromUtf8(QVar13);
            QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_68.stream,' ');
            }
            *(int *)((QTextStream *)local_68.stream + 0x28) =
                 *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
            ::operator<<((Stream *)&local_58,(QWidget *)local_60);
            QVar1.stream = local_58.stream;
            QVar14.m_data = (storage_type *)0x10;
            QVar14.m_size = (qsizetype)local_50;
            QString::fromUtf8(QVar14);
            QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_58.stream,' ');
            }
            QDebug::~QDebug(&local_58);
            QDebug::~QDebug((QDebug *)local_60);
            QDebug::~QDebug(&local_68);
            QDebug::~QDebug((QDebug *)&local_70);
            QDebug::~QDebug(&local_78);
          }
          QRegion::operator+=((QRegion *)(this + 0x48),region);
        }
        else {
          bVar2 = hasPlatformWindow(widget);
          if ((bVar2) ||
             (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
            pQVar4 = QtPrivateLogging::lcWidgetPainting();
            if (((pQVar4->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
              local_80 = pQVar4->name;
              local_98.xp.m_i = 2;
              local_98.yp.m_i = 0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_84 = 0;
              QMessageLogger::info();
              QVar1.stream = local_78.stream;
              QVar9.m_data = (storage_type *)0x7;
              QVar9.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar9);
              QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_78.stream,' ');
              }
              *(int *)((QTextStream *)local_78.stream + 0x28) =
                   *(int *)((QTextStream *)local_78.stream + 0x28) + 1;
              ::operator<<((Stream *)&local_68,&local_d8);
              QVar1.stream = local_68.stream;
              QVar10.m_data = (storage_type *)0xf;
              QVar10.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar10);
              QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_68.stream,' ');
              }
              *(int *)((QTextStream *)local_68.stream + 0x28) =
                   *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
              ::operator<<((Stream *)&local_58,(QWidget *)local_d0);
              QVar1.stream = local_58.stream;
              QVar11.m_data = (storage_type *)0x10;
              QVar11.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar11);
              QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QDebug::~QDebug(&local_58);
              QDebug::~QDebug((QDebug *)local_d0);
              QDebug::~QDebug(&local_68);
              QDebug::~QDebug((QDebug *)&local_d8);
              QDebug::~QDebug(&local_78);
            }
            markNeedsFlush(this,widget,region);
          }
          else {
            parent = QWidget::nativeParentWidget(widget);
            pQVar4 = QtPrivateLogging::lcWidgetPainting();
            if (((pQVar4->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
              local_80 = pQVar4->name;
              local_98.xp.m_i = 2;
              local_98.yp.m_i = 0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_84 = 0;
              QMessageLogger::info();
              QVar1.stream = local_c8.stream;
              QVar5.m_data = (storage_type *)0x7;
              QVar5.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar5);
              QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_c8.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_c8.stream,' ');
              }
              *(int *)((QTextStream *)local_c8.stream + 0x28) =
                   *(int *)((QTextStream *)local_c8.stream + 0x28) + 1;
              ::operator<<((Stream *)&local_78,&local_c0);
              QVar1.stream = local_78.stream;
              QVar6.m_data = (storage_type *)0x2;
              QVar6.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar6);
              QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_78.stream,' ');
              }
              *(int *)((QTextStream *)local_78.stream + 0x28) =
                   *(int *)((QTextStream *)local_78.stream + 0x28) + 1;
              ::operator<<((Stream *)&local_68,(QWidget *)local_b8);
              QVar1.stream = local_68.stream;
              QVar7.m_data = (storage_type *)0x13;
              QVar7.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar7);
              QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_68.stream,' ');
              }
              *(int *)((QTextStream *)local_68.stream + 0x28) =
                   *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
              ::operator<<((Stream *)&local_58,(QWidget *)local_b0);
              QVar1.stream = local_58.stream;
              QVar8.m_data = (storage_type *)0x9;
              QVar8.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar8);
              QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              *(int *)((QTextStream *)local_58.stream + 0x28) =
                   *(int *)((QTextStream *)local_58.stream + 0x28) + 1;
              ::operator<<((Stream *)local_a0,(QPoint *)(local_b0 + 8));
              QDebug::~QDebug((QDebug *)local_a0);
              QDebug::~QDebug((QDebug *)(local_b0 + 8));
              QDebug::~QDebug(&local_58);
              QDebug::~QDebug((QDebug *)local_b0);
              QDebug::~QDebug(&local_68);
              QDebug::~QDebug((QDebug *)local_b8);
              QDebug::~QDebug(&local_78);
              QDebug::~QDebug((QDebug *)&local_c0);
              QDebug::~QDebug(&local_c8);
            }
            if (parent == *(QWidget **)this) {
              QRegion::translated((int)&local_98,(int)region);
              QRegion::operator+=((QRegion *)(this + 0x48),(QRegion *)&local_98);
            }
            else {
              local_98.xp.m_i = 0;
              local_98.yp.m_i = 0;
              QWidget::mapTo(widget,parent,&local_98);
              QRegion::translated((int)&local_98,(int)region);
              markNeedsFlush(this,parent,(QRegion *)&local_98);
            }
            QRegion::~QRegion((QRegion *)&local_98);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::markNeedsFlush(QWidget *widget, const QRegion &region, const QPoint &topLevelOffset)
{
    if (!widget || widget->d_func()->shouldPaintOnScreen() || region.isEmpty())
        return;

    if (widget == tlw) {
        // Top-level (native)
        qCInfo(lcWidgetPainting) << "Marking" << region << "of top level"
            << widget << "as needing flush";
        topLevelNeedsFlush += region;
    } else if (!hasPlatformWindow(widget) && !widget->isWindow()) {
        QWidget *nativeParent = widget->nativeParentWidget();
        qCInfo(lcWidgetPainting) << "Marking" << region << "of"
                << widget << "as needing flush in" << nativeParent
                << "at offset" << topLevelOffset;
        if (nativeParent == tlw) {
            // Alien widgets with the top-level as the native parent (common case)
            topLevelNeedsFlush += region.translated(topLevelOffset);
        } else {
            // Alien widgets with native parent != tlw
            const QPoint nativeParentOffset = widget->mapTo(nativeParent, QPoint());
            markNeedsFlush(nativeParent, region.translated(nativeParentOffset));
        }
    } else {
        // Native child widgets
        qCInfo(lcWidgetPainting) << "Marking" << region
            << "of native child" << widget << "as needing flush";
        markNeedsFlush(widget, region);
    }
}